

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.h
# Opt level: O0

void __thiscall
mjs::native_object::update_property_attributes
          (native_object *this,char *name,property_attribute attributes)

{
  property_attribute pVar1;
  native_object_property *pnVar2;
  bool bVar3;
  native_object_property *it;
  property_attribute attributes_local;
  char *name_local;
  native_object *this_local;
  
  pnVar2 = find(this,name);
  if (pnVar2 == (native_object_property *)0x0) {
    __assert_fail("it",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/native_object.h"
                  ,0x4f,
                  "void mjs::native_object::update_property_attributes(const char *, property_attribute)"
                 );
  }
  pVar1 = operator&(attributes,read_only);
  bVar3 = true;
  if (pVar1 == none) {
    bVar3 = pnVar2->put != (put_func)0x0;
  }
  if (!bVar3) {
    __assert_fail("((attributes & property_attribute::read_only) != property_attribute::none) || it->put"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/native_object.h"
                  ,0x50,
                  "void mjs::native_object::update_property_attributes(const char *, property_attribute)"
                 );
  }
  pnVar2->attributes = attributes;
  return;
}

Assistant:

void update_property_attributes(const char* name, property_attribute attributes) {
        auto it = find(name);
        assert(it);
        assert(((attributes & property_attribute::read_only) != property_attribute::none) || it->put);
        it->attributes = attributes;
    }